

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O1

Maybe<kj::Promise<unsigned_long>_> __thiscall
kj::anon_unknown_0::AsyncStreamFd::tryPumpFrom
          (AsyncStreamFd *this,AsyncInputStream *input,uint64_t amount)

{
  PromiseArena *pPVar1;
  _func_int ***ppp_Var2;
  uchar *puVar3;
  size_t sVar4;
  undefined8 uVar5;
  uint uVar6;
  _func_int **readSoFar;
  ssize_t sVar7;
  long lVar8;
  PromiseArenaMember *pPVar9;
  Exception *__dest;
  void *pvVar10;
  Fault FVar11;
  PromiseArenaMember *in_RCX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_02;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_03;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_04;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 aVar12;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_05;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_06;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_07;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_08;
  FileInputStream *file;
  size_t sVar13;
  int iVar14;
  PromiseArenaMember *__n;
  PromiseArenaMember *pPVar15;
  TransformPromiseNodeBase *this_00;
  bool bVar16;
  undefined1 auVar17 [16];
  Maybe<kj::Promise<unsigned_long>_> MVar18;
  Promise<void> promise;
  Fault f;
  byte buffer [4096];
  Array<unsigned_char> local_10c0;
  Fault local_10a8;
  size_t sStack_10a0;
  undefined8 *local_1098;
  undefined1 local_1088 [72];
  TransformPromiseNodeBase *local_1040;
  AsyncStreamFd local_1038 [24];
  
  local_10c0.disposer = (ArrayDisposer *)input;
  local_1088._40_8_ = amount;
  readSoFar = (_func_int **)
              __dynamic_cast(amount,&AsyncInputStream::typeinfo,
                             &(anonymous_namespace)::AsyncStreamFd::typeinfo);
  if (readSoFar != (_func_int **)0x0) {
    __n = (PromiseArenaMember *)0x0;
    local_1088._32_8_ = this;
    memset(local_1038,0,0x1000);
    local_1088._48_8_ = (PromiseArenaMember *)0x1000;
    if (in_RCX < (PromiseArenaMember *)0x1000) {
      local_1088._48_8_ = in_RCX;
    }
    local_10c0.size_ = (size_t)in_RCX;
    do {
      sVar13 = local_1088._48_8_ - (long)__n;
      bVar16 = false;
      if ((ulong)local_1088._48_8_ < __n || sVar13 == 0) break;
      ppp_Var2 = &__n->_vptr_PromiseArenaMember;
      local_1088._56_8_ = __n;
      do {
        sVar7 = read(*(int *)(readSoFar + 2),
                     (byte *)((long)ppp_Var2 + (long)&local_1038[0].super_AsyncCapabilityStream),
                     sVar13);
        if (-1 < sVar7) {
          iVar14 = 0;
          break;
        }
        uVar6 = kj::_::Debug::getOsErrorNumber(true);
        __n = (PromiseArenaMember *)((ulong)__n & 0xffffffff);
        if (uVar6 != 0xffffffff) {
          __n = (PromiseArenaMember *)(ulong)uVar6;
        }
        iVar14 = (int)__n;
      } while (uVar6 == 0xffffffff);
      if (iVar14 != 0) {
        local_10a8.exception = (Exception *)0x0;
        local_1088._0_8_ = (PromiseNode *)0x0;
        local_1088._8_8_ = (_func_int **)0x0;
        kj::_::Debug::Fault::init
                  (&local_10a8,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                  );
        kj::_::Debug::Fault::fatal(&local_10a8);
      }
      lVar8 = 0;
      if (0 < sVar7) {
        lVar8 = sVar7;
      }
      __n = (PromiseArenaMember *)((long)(_func_int ***)local_1088._56_8_ + lVar8);
      bVar16 = sVar7 == 0;
    } while (0 < sVar7);
    pPVar15 = __n;
    do {
      pPVar9 = (PromiseArenaMember *)
               ::write(((OwnedFileDescriptor *)((long)local_10c0.disposer + 0x10))->fd,local_1038,
                       (size_t)__n);
      if (-1 < (long)pPVar9) {
        iVar14 = 0;
        break;
      }
      uVar6 = kj::_::Debug::getOsErrorNumber(true);
      pPVar15 = (PromiseArenaMember *)((ulong)pPVar15 & 0xffffffff);
      if (uVar6 != 0xffffffff) {
        pPVar15 = (PromiseArenaMember *)(ulong)uVar6;
      }
      iVar14 = (int)pPVar15;
    } while (uVar6 == 0xffffffff);
    if (iVar14 != 0) {
      local_10a8.exception = (Exception *)0x0;
      local_1088._0_8_ = (PromiseNode *)0x0;
      local_1088._8_8_ = (_func_int **)0x0;
      kj::_::Debug::Fault::init
                (&local_10a8,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                );
      kj::_::Debug::Fault::fatal(&local_10a8);
    }
    pPVar15 = (PromiseArenaMember *)0x0;
    if (0 < (long)pPVar9) {
      pPVar15 = pPVar9;
    }
    sVar13 = (long)__n - (long)pPVar15;
    if (__n < pPVar15 || sVar13 == 0) {
      if ((bool)(__n != (PromiseArenaMember *)local_10c0.size_ & (bVar16 ^ 1U))) {
        splicePumpFrom((AsyncStreamFd *)local_1088,(AsyncStreamFd *)local_10c0.disposer,
                       (uint64_t)readSoFar,(uint64_t)__n);
        *(undefined1 *)
         &(((AsyncCapabilityStream *)local_1088._32_8_)->super_AsyncIoStream).super_AsyncInputStream
          ._vptr_AsyncInputStream = 1;
        FVar11.exception = (Exception *)local_1088._0_8_;
        aVar12 = extraout_RDX_01;
      }
      else {
        local_1088._0_8_ = __n;
        kj::_::PromiseDisposer::
        alloc<kj::_::ImmediatePromiseNode<unsigned_long>,kj::_::PromiseDisposer,unsigned_long>
                  ((PromiseDisposer *)&local_10a8,(unsigned_long *)local_1088);
        *(undefined1 *)
         &(((AsyncCapabilityStream *)local_1088._32_8_)->super_AsyncIoStream).super_AsyncInputStream
          ._vptr_AsyncInputStream = 1;
        FVar11.exception = local_10a8.exception;
        aVar12 = extraout_RDX_00;
      }
      ((AsyncOutputStream *)(local_1088._32_8_ + 8))->_vptr_AsyncOutputStream =
           (_func_int **)FVar11.exception;
      this = (AsyncStreamFd *)local_1088._32_8_;
    }
    else {
      __dest = (Exception *)
               kj::_::HeapArrayDisposer::allocateImpl
                         (1,0,sVar13,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      memcpy(__dest,(byte *)((long)&pPVar15->_vptr_PromiseArenaMember +
                            (long)&local_1038[0].super_AsyncCapabilityStream),sVar13);
      local_1098 = &kj::_::HeapArrayDisposer::instance;
      local_10a8.exception = __dest;
      sStack_10a0 = sVar13;
      (*(((AsyncCapabilityStream *)&(local_10c0.disposer)->_vptr_ArrayDisposer)->super_AsyncIoStream
        ).super_AsyncInputStream._vptr_AsyncInputStream[0x14])
                (&local_10c0,local_10c0.disposer,__dest,sVar13);
      sVar4 = local_10c0.size_;
      Promise<void>::attach<kj::Array<unsigned_char>>((Promise<void> *)local_1088,&local_10c0);
      puVar3 = local_10c0.ptr;
      local_10c0.ptr = (uchar *)local_1088._0_8_;
      local_1088._0_8_ = (PromiseArenaMember *)0x0;
      if ((PromiseArenaMember *)puVar3 != (PromiseArenaMember *)0x0) {
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)puVar3);
      }
      uVar5 = local_1088._0_8_;
      if ((PromiseNode *)local_1088._0_8_ != (PromiseNode *)0x0) {
        local_1088._0_8_ = (PromiseArenaMember *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar5);
      }
      puVar3 = local_10c0.ptr;
      if ((bool)(__n != (PromiseArenaMember *)sVar4 & (bVar16 ^ 1U))) {
        pPVar1 = *(PromiseArena **)((long)local_10c0.ptr + 8);
        if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_10c0.ptr - (long)pPVar1) < 0x40) {
          pvVar10 = operator_new(0x400);
          this_00 = (TransformPromiseNodeBase *)((long)pvVar10 + 0x3c0);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (this_00,(OwnPromiseNode *)&local_10c0,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:354:31)>
                     ::anon_class_32_4_8eb467c7_for_func::operator());
          *(undefined ***)((long)pvVar10 + 0x3c0) = &PTR_destroy_0064a0a0;
          *(_func_int ***)((long)pvVar10 + 0x3e0) = readSoFar;
          *(ArrayDisposer **)((long)pvVar10 + 1000) = local_10c0.disposer;
          *(PromiseArenaMember **)((long)pvVar10 + 0x3f0) = __n;
          *(size_t *)((long)pvVar10 + 0x3f8) = local_10c0.size_;
          *(void **)((long)pvVar10 + 0x3c8) = pvVar10;
        }
        else {
          *(PromiseArena **)((long)local_10c0.ptr + 8) = (PromiseArena *)0x0;
          this_00 = (TransformPromiseNodeBase *)((long)local_10c0.ptr + -0x40);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (this_00,(OwnPromiseNode *)&local_10c0,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:354:31)>
                     ::anon_class_32_4_8eb467c7_for_func::operator());
          ((PromiseArenaMember *)((long)puVar3 + -0x40))->_vptr_PromiseArenaMember =
               (_func_int **)&PTR_destroy_0064a0a0;
          ((PromiseArenaMember *)((long)puVar3 + -0x20))->_vptr_PromiseArenaMember = readSoFar;
          ((PromiseArenaMember *)((long)puVar3 + -0x20))->arena =
               (PromiseArena *)local_10c0.disposer;
          ((PromiseArenaMember *)((long)puVar3 + -0x10))->_vptr_PromiseArenaMember =
               (_func_int **)__n;
          ((PromiseArenaMember *)((long)puVar3 + -0x10))->arena = (PromiseArena *)local_10c0.size_;
          ((PromiseArenaMember *)((long)puVar3 + -0x40))->arena = pPVar1;
        }
        local_1088._0_8_ = &DAT_004a8171;
        local_1088._8_8_ = &DAT_004a81d0;
        local_1088._16_8_ = &DAT_4c0000058b;
        local_1088._64_8_ = this_00;
        kj::_::PromiseDisposer::
        appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
                  ((PromiseDisposer *)&local_1040,(OwnPromiseNode *)(local_1088 + 0x40),
                   (SourceLocation *)local_1088);
        uVar5 = local_1088._64_8_;
        aVar12 = extraout_RDX_03;
        if ((TransformPromiseNodeBase *)local_1088._64_8_ != (TransformPromiseNodeBase *)0x0) {
          local_1088._64_8_ = (TransformPromiseNodeBase *)0x0;
          kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar5);
          aVar12 = extraout_RDX_04;
        }
      }
      else {
        pPVar1 = *(PromiseArena **)((long)local_10c0.ptr + 8);
        if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_10c0.ptr - (long)pPVar1) < 0x28) {
          pvVar10 = operator_new(0x400);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    ((TransformPromiseNodeBase *)((long)pvVar10 + 0x3d8),
                     (OwnPromiseNode *)&local_10c0,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:352:31)>
                     ::anon_class_8_1_ba1d6db4_for_func::operator());
          *(undefined ***)((long)pvVar10 + 0x3d8) = &PTR_destroy_0064a048;
          *(PromiseArenaMember **)((long)pvVar10 + 0x3f8) = __n;
          *(void **)((long)pvVar10 + 0x3e0) = pvVar10;
          aVar12 = extraout_RDX;
          local_1040 = (TransformPromiseNodeBase *)((long)pvVar10 + 0x3d8);
        }
        else {
          *(PromiseArena **)((long)local_10c0.ptr + 8) = (PromiseArena *)0x0;
          pPVar15 = (PromiseArenaMember *)((long)local_10c0.ptr + -0x30);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    ((TransformPromiseNodeBase *)&pPVar15->arena,(OwnPromiseNode *)&local_10c0,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:352:31)>
                     ::anon_class_8_1_ba1d6db4_for_func::operator());
          ((PromiseArenaMember *)((long)puVar3 + -0x30))->arena =
               (PromiseArena *)&PTR_destroy_0064a048;
          ((PromiseArenaMember *)((long)puVar3 + -0x10))->arena = (PromiseArena *)__n;
          ((PromiseArenaMember *)((long)puVar3 + -0x20))->_vptr_PromiseArenaMember =
               (_func_int **)pPVar1;
          aVar12 = extraout_RDX_02;
          local_1040 = (TransformPromiseNodeBase *)&pPVar15->arena;
        }
      }
      this = (AsyncStreamFd *)local_1088._32_8_;
      puVar3 = local_10c0.ptr;
      *(undefined1 *)
       &(((AsyncCapabilityStream *)local_1088._32_8_)->super_AsyncIoStream).super_AsyncInputStream.
        _vptr_AsyncInputStream = 1;
      ((AsyncOutputStream *)(local_1088._32_8_ + 8))->_vptr_AsyncOutputStream =
           (_func_int **)local_1040;
      if ((PromiseArenaMember *)local_10c0.ptr != (PromiseArenaMember *)0x0) {
        local_10c0.ptr = (uchar *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)puVar3);
        aVar12 = extraout_RDX_05;
      }
      sVar13 = sStack_10a0;
      FVar11.exception = local_10a8.exception;
      if (local_10a8.exception != (Exception *)0x0) {
        local_10a8.exception = (Exception *)0x0;
        sStack_10a0 = 0;
        (**(code **)*local_1098)(local_1098,FVar11.exception,1,sVar13,sVar13,0);
        aVar12 = extraout_RDX_06;
      }
    }
    in_RCX = (PromiseArenaMember *)local_10c0.size_;
    if (readSoFar != (_func_int **)0x0) goto LAB_0044e0a5;
  }
  auVar17 = __dynamic_cast(local_1088._40_8_,&AsyncInputStream::typeinfo,&FileInputStream::typeinfo,
                           0);
  aVar12 = auVar17._8_8_;
  if (auVar17._0_8_ != 0) {
    (**(code **)**(undefined8 **)(auVar17._0_8_ + 8))(local_1038);
    aVar12 = extraout_RDX_07;
    if ((char)local_1038[0].super_AsyncCapabilityStream.super_AsyncIoStream.super_AsyncInputStream.
              _vptr_AsyncInputStream == '\x01') {
      pumpFromFile(local_1038,(FileInputStream *)local_10c0.disposer,auVar17._0_4_,
                   (ulong)local_1038[0].super_AsyncCapabilityStream.super_AsyncIoStream.
                          super_AsyncInputStream._vptr_AsyncInputStream._4_4_,(uint64_t)in_RCX);
      *(undefined1 *)
       &(((AsyncCapabilityStream *)&((UnixEventPort *)this)->super_EventPort)->super_AsyncIoStream).
        super_AsyncInputStream._vptr_AsyncInputStream = 1;
      ((AsyncOutputStream *)&((UnixEventPort *)this)->super_SleepHooks)->_vptr_AsyncOutputStream =
           (_func_int **)
           CONCAT44(local_1038[0].super_AsyncCapabilityStream.super_AsyncIoStream.
                    super_AsyncInputStream._vptr_AsyncInputStream._4_4_,
                    local_1038[0].super_AsyncCapabilityStream.super_AsyncIoStream.
                    super_AsyncInputStream._vptr_AsyncInputStream._0_4_);
      aVar12 = extraout_RDX_08;
      goto LAB_0044e0a5;
    }
  }
  *(undefined1 *)
   &(((AsyncCapabilityStream *)&((UnixEventPort *)this)->super_EventPort)->super_AsyncIoStream).
    super_AsyncInputStream._vptr_AsyncInputStream = 0;
LAB_0044e0a5:
  MVar18.ptr.field_1 = aVar12;
  MVar18.ptr._0_8_ = this;
  return (Maybe<kj::Promise<unsigned_long>_>)MVar18.ptr;
}

Assistant:

Maybe<Promise<uint64_t>> tryPumpFrom(
      AsyncInputStream& input, uint64_t amount = kj::maxValue) override {
#if __linux__ && !__ANDROID__
    KJ_IF_SOME(sock, kj::dynamicDowncastIfAvailable<AsyncStreamFd>(input)) {
      return pumpFromOther(sock, amount);
    }
#endif

#if __linux__
    KJ_IF_SOME(file, kj::dynamicDowncastIfAvailable<FileInputStream>(input)) {
      KJ_IF_SOME(fd, file.getUnderlyingFile().getFd()) {
        return pumpFromFile(file, fd, amount, 0);
      }
    }
#endif

    return kj::none;
  }